

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  uint uVar1;
  color_quad<unsigned_char,_int> *pPixels;
  level_details *plVar2;
  uint level;
  uint uVar3;
  conversion_type conv_type;
  ulong uVar4;
  crn_comp_params *pcVar5;
  uint uVar6;
  uint level_index;
  ulong uVar7;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar8;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar9;
  long lVar10;
  ulong uVar11;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  image_u8 cooked_image;
  
  piVar8 = this->m_images[0];
  pcVar5 = this->m_pParams;
  lVar10 = 0x28;
  uVar4 = 0;
  piVar9 = piVar8;
  while( true ) {
    uVar1 = pcVar5->m_faces;
    if (uVar1 <= uVar4) break;
    this_00 = piVar9;
    for (uVar7 = 0; uVar7 < pcVar5->m_levels; uVar7 = uVar7 + 1) {
      pPixels = *(color_quad<unsigned_char,_int> **)
                 ((long)(pcVar5->m_pImages + -1) + 0x58 + uVar7 * 8 + lVar10);
      if (pPixels == (color_quad<unsigned_char,_int> *)0x0) goto LAB_001591fa;
      uVar3 = pcVar5->m_height >> ((byte)uVar7 & 0x1f);
      uVar6 = pcVar5->m_width >> ((byte)uVar7 & 0x1f);
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                (this_00,pPixels,uVar6 + (uVar6 == 0),uVar3 + (uVar3 == 0),0xffffffff,0xf);
      pcVar5 = this->m_pParams;
      this_00 = this_00 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar10 = lVar10 + 0x80;
    piVar9 = piVar9 + 0x10;
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar5->m_format);
  pcVar5 = this->m_pParams;
  if (conv_type != cConversion_Invalid) {
    for (uVar7 = 0; uVar7 < pcVar5->m_faces; uVar7 = uVar7 + 1) {
      piVar9 = piVar8;
      for (uVar11 = 0; uVar11 < pcVar5->m_levels; uVar11 = uVar11 + 1) {
        image<crnlib::color_quad<unsigned_char,_int>_>::image(&cooked_image,piVar9);
        image_utils::convert_image(&cooked_image,conv_type);
        image<crnlib::color_quad<unsigned_char,_int>_>::swap(piVar9,&cooked_image);
        vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&cooked_image.m_pixel_buf);
        pcVar5 = this->m_pParams;
        piVar9 = piVar9 + 1;
      }
      piVar8 = piVar8 + 0x10;
    }
  }
  lVar10 = 0;
  vector<crnlib::crn_comp::level_details>::resize(&this->m_levels,pcVar5->m_levels,false);
  this->m_total_blocks = 0;
  for (uVar7 = 0; pcVar5 = this->m_pParams, uVar7 < pcVar5->m_levels; uVar7 = uVar7 + 1) {
    uVar3 = pcVar5->m_height >> ((byte)uVar7 & 0x1f);
    uVar6 = pcVar5->m_width >> ((byte)uVar7 & 0x1f);
    *(uint *)((long)&((this->m_levels).m_p)->block_width + lVar10) =
         (uVar6 + 7 + (uint)(uVar6 == 0) & 0xfffffff8) >> (2U - this->m_has_subblocks & 0x1f);
    *(uint *)((long)&((this->m_levels).m_p)->first_block + lVar10) = this->m_total_blocks;
    plVar2 = (this->m_levels).m_p;
    *(uint *)((long)&plVar2->num_blocks + lVar10) =
         (uVar3 + 7 + (uint)(uVar3 == 0) >> 2 & 0xfffffffe) * this->m_pParams->m_faces *
         *(int *)((long)&plVar2->block_width + lVar10);
    this->m_total_blocks =
         this->m_total_blocks + *(int *)((long)&((this->m_levels).m_p)->num_blocks + lVar10);
    lVar10 = lVar10 + 0xc;
  }
LAB_001591fa:
  return uVar1 <= uVar4;
}

Assistant:

bool crn_comp::alias_images() {
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
      if (!m_pParams->m_pImages[face_index][level_index])
        return false;
      m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
    }
  }

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(m_images[face_index][level_index]);
        image_utils::convert_image(cooked_image, conv_type);
        m_images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  m_levels.resize(m_pParams->m_levels);
  m_total_blocks = 0;
  for (uint level = 0; level < m_pParams->m_levels; level++) {
    uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
    m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
    m_levels[level].first_block = m_total_blocks;
    m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
    m_total_blocks += m_levels[level].num_blocks;
  }

  return true;
}